

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  size_t sVar4;
  undefined8 uVar5;
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  ulong uVar19;
  ulong unaff_R12;
  size_t mask;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  int iVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 (*unaff_R14) [16];
  ulong uVar26;
  long lVar27;
  float fVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar47;
  float fVar51;
  vint4 bi;
  uint uVar48;
  uint uVar52;
  float fVar55;
  uint uVar56;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar49;
  float fVar50;
  float fVar53;
  float fVar54;
  float fVar57;
  float fVar58;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar59;
  float fVar60;
  int iVar65;
  int iVar68;
  vint4 bi_1;
  float fVar66;
  float fVar67;
  float fVar69;
  float fVar70;
  int iVar71;
  float fVar72;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar73;
  float fVar83;
  float fVar85;
  vint4 ai;
  uint uVar74;
  uint uVar84;
  uint uVar86;
  float fVar87;
  uint uVar88;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar89;
  float fVar95;
  float fVar96;
  vint4 ai_1;
  float fVar97;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar102;
  float fVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar101 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  float fVar117;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_11c8;
  undefined8 local_11b8;
  undefined1 local_1168 [16];
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138 [4];
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [8];
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [16];
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088 [4];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  vbool<4> valid;
  
  pauVar17 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  local_fb8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fc8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fd8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1008 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1018 = (tray->tnear).field_0.i[k];
  iVar23 = (tray->tfar).field_0.i[k];
  local_1028 = mm_lookupmask_ps._0_8_;
  uStack_1020 = mm_lookupmask_ps._8_8_;
  local_1038 = mm_lookupmask_ps._240_8_;
  uStack_1030 = mm_lookupmask_ps._248_8_;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  iStack_1014 = local_1018;
  iStack_1010 = local_1018;
  iStack_100c = local_1018;
  fVar123 = local_fb8;
  fVar30 = local_fb8;
  fVar49 = local_fb8;
  fVar53 = local_fb8;
  fVar57 = local_fc8;
  fVar139 = local_fc8;
  fVar141 = local_fc8;
  fVar143 = local_fc8;
  fVar145 = local_fd8;
  fVar89 = local_fd8;
  fVar95 = local_fd8;
  fVar96 = local_fd8;
  fVar97 = local_fe8;
  fVar31 = local_fe8;
  fVar50 = local_fe8;
  fVar54 = local_fe8;
  fVar58 = local_1008;
  fVar59 = local_1008;
  fVar60 = local_1008;
  fVar66 = local_1008;
  iVar147 = local_1018;
  iVar148 = local_1018;
  iVar149 = local_1018;
  iVar150 = local_1018;
  iVar65 = iVar23;
  iVar68 = iVar23;
  iVar71 = iVar23;
  fVar67 = local_ff8;
  fVar69 = local_ff8;
  fVar70 = local_ff8;
  fVar72 = local_ff8;
  do {
    do {
      do {
        pauVar13 = (undefined1 (*) [16])&local_f78;
        if (pauVar17 == pauVar13) {
          return;
        }
        pauVar16 = pauVar17 + -1;
        pauVar17 = pauVar17 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= *(float *)((long)*pauVar16 + 8) &&
               *(float *)((long)*pauVar16 + 8) != *(float *)(ray + k * 4 + 0x80));
      sVar21 = *(size_t *)*pauVar17;
      pauVar16 = pauVar17;
      do {
        if ((sVar21 & 8) == 0) {
          pfVar1 = (float *)(sVar21 + 0x20 + uVar14);
          fVar28 = (*pfVar1 - fVar123) * fVar97;
          fVar47 = (pfVar1[1] - fVar30) * fVar31;
          fVar51 = (pfVar1[2] - fVar49) * fVar50;
          fVar55 = (pfVar1[3] - fVar53) * fVar54;
          pfVar1 = (float *)(sVar21 + 0x20 + uVar18);
          fVar73 = (*pfVar1 - fVar57) * fVar67;
          fVar83 = (pfVar1[1] - fVar139) * fVar69;
          fVar85 = (pfVar1[2] - fVar141) * fVar70;
          fVar87 = (pfVar1[3] - fVar143) * fVar72;
          uVar74 = (uint)((int)fVar73 < (int)fVar28) * (int)fVar28 |
                   (uint)((int)fVar73 >= (int)fVar28) * (int)fVar73;
          uVar84 = (uint)((int)fVar83 < (int)fVar47) * (int)fVar47 |
                   (uint)((int)fVar83 >= (int)fVar47) * (int)fVar83;
          uVar86 = (uint)((int)fVar85 < (int)fVar51) * (int)fVar51 |
                   (uint)((int)fVar85 >= (int)fVar51) * (int)fVar85;
          uVar88 = (uint)((int)fVar87 < (int)fVar55) * (int)fVar55 |
                   (uint)((int)fVar87 >= (int)fVar55) * (int)fVar87;
          pfVar1 = (float *)(sVar21 + 0x20 + uVar19);
          fVar28 = (*pfVar1 - fVar145) * fVar58;
          fVar47 = (pfVar1[1] - fVar89) * fVar59;
          fVar51 = (pfVar1[2] - fVar95) * fVar60;
          fVar55 = (pfVar1[3] - fVar96) * fVar66;
          uVar29 = (uint)((int)fVar28 < iVar147) * iVar147 |
                   (uint)((int)fVar28 >= iVar147) * (int)fVar28;
          uVar48 = (uint)((int)fVar47 < iVar148) * iVar148 |
                   (uint)((int)fVar47 >= iVar148) * (int)fVar47;
          uVar52 = (uint)((int)fVar51 < iVar149) * iVar149 |
                   (uint)((int)fVar51 >= iVar149) * (int)fVar51;
          uVar56 = (uint)((int)fVar55 < iVar150) * iVar150 |
                   (uint)((int)fVar55 >= iVar150) * (int)fVar55;
          local_1138[0] =
               (float)(((int)uVar29 < (int)uVar74) * uVar74 | ((int)uVar29 >= (int)uVar74) * uVar29)
          ;
          local_1138[1] =
               (float)(((int)uVar48 < (int)uVar84) * uVar84 | ((int)uVar48 >= (int)uVar84) * uVar48)
          ;
          local_1138[2] =
               (float)(((int)uVar52 < (int)uVar86) * uVar86 | ((int)uVar52 >= (int)uVar86) * uVar52)
          ;
          local_1138[3] =
               (float)(((int)uVar56 < (int)uVar88) * uVar88 | ((int)uVar56 >= (int)uVar88) * uVar56)
          ;
          pfVar1 = (float *)(sVar21 + 0x20 + (uVar14 ^ 0x10));
          fVar28 = (*pfVar1 - fVar123) * fVar97;
          fVar47 = (pfVar1[1] - fVar30) * fVar31;
          fVar51 = (pfVar1[2] - fVar49) * fVar50;
          fVar55 = (pfVar1[3] - fVar53) * fVar54;
          pfVar1 = (float *)(sVar21 + 0x20 + (uVar18 ^ 0x10));
          fVar73 = (*pfVar1 - fVar57) * fVar67;
          fVar83 = (pfVar1[1] - fVar139) * fVar69;
          fVar85 = (pfVar1[2] - fVar141) * fVar70;
          fVar87 = (pfVar1[3] - fVar143) * fVar72;
          uVar74 = (uint)((int)fVar28 < (int)fVar73) * (int)fVar28 |
                   (uint)((int)fVar28 >= (int)fVar73) * (int)fVar73;
          uVar84 = (uint)((int)fVar47 < (int)fVar83) * (int)fVar47 |
                   (uint)((int)fVar47 >= (int)fVar83) * (int)fVar83;
          uVar86 = (uint)((int)fVar51 < (int)fVar85) * (int)fVar51 |
                   (uint)((int)fVar51 >= (int)fVar85) * (int)fVar85;
          uVar88 = (uint)((int)fVar55 < (int)fVar87) * (int)fVar55 |
                   (uint)((int)fVar55 >= (int)fVar87) * (int)fVar87;
          pfVar1 = (float *)(sVar21 + 0x20 + (uVar19 ^ 0x10));
          fVar28 = (*pfVar1 - fVar145) * fVar58;
          fVar47 = (pfVar1[1] - fVar89) * fVar59;
          fVar51 = (pfVar1[2] - fVar95) * fVar60;
          fVar55 = (pfVar1[3] - fVar96) * fVar66;
          uVar29 = (uint)(iVar23 < (int)fVar28) * iVar23 |
                   (uint)(iVar23 >= (int)fVar28) * (int)fVar28;
          uVar48 = (uint)(iVar65 < (int)fVar47) * iVar65 |
                   (uint)(iVar65 >= (int)fVar47) * (int)fVar47;
          uVar52 = (uint)(iVar68 < (int)fVar51) * iVar68 |
                   (uint)(iVar68 >= (int)fVar51) * (int)fVar51;
          uVar56 = (uint)(iVar71 < (int)fVar55) * iVar71 |
                   (uint)(iVar71 >= (int)fVar55) * (int)fVar55;
          auVar80._0_4_ =
               -(uint)((int)(((int)uVar74 < (int)uVar29) * uVar74 |
                            ((int)uVar74 >= (int)uVar29) * uVar29) < (int)local_1138[0]);
          auVar80._4_4_ =
               -(uint)((int)(((int)uVar84 < (int)uVar48) * uVar84 |
                            ((int)uVar84 >= (int)uVar48) * uVar48) < (int)local_1138[1]);
          auVar80._8_4_ =
               -(uint)((int)(((int)uVar86 < (int)uVar52) * uVar86 |
                            ((int)uVar86 >= (int)uVar52) * uVar52) < (int)local_1138[2]);
          auVar80._12_4_ =
               -(uint)((int)(((int)uVar88 < (int)uVar56) * uVar88 |
                            ((int)uVar88 >= (int)uVar56) * uVar56) < (int)local_1138[3]);
          uVar29 = movmskps((int)pauVar13,auVar80);
          unaff_R12 = ((ulong)uVar29 ^ 0xf) & 0xff;
        }
        pauVar17 = pauVar16;
        if ((sVar21 & 8) == 0) {
          if (unaff_R12 == 0) {
            pauVar13 = (undefined1 (*) [16])0x4;
          }
          else {
            uVar20 = sVar21 & 0xfffffffffffffff0;
            lVar15 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
              }
            }
            pauVar13 = (undefined1 (*) [16])0x0;
            sVar21 = *(size_t *)(uVar20 + lVar15 * 8);
            unaff_R14 = (undefined1 (*) [16])(unaff_R12 - 1 & unaff_R12);
            if (unaff_R14 != (undefined1 (*) [16])0x0) {
              fVar28 = local_1138[lVar15];
              lVar15 = 0;
              if (unaff_R14 != (undefined1 (*) [16])0x0) {
                for (; ((ulong)unaff_R14 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
              sVar4 = *(size_t *)(uVar20 + lVar15 * 8);
              fVar47 = local_1138[lVar15];
              uVar22 = (ulong)((long)unaff_R14[-1] + 0xfU) & (ulong)unaff_R14;
              if (uVar22 == 0) {
                pauVar17 = pauVar16 + 1;
                unaff_R14 = pauVar17;
                if ((uint)fVar28 < (uint)fVar47) {
                  *(size_t *)*pauVar16 = sVar4;
                  *(float *)((long)*pauVar16 + 8) = fVar47;
                }
                else {
                  *(size_t *)*pauVar16 = sVar21;
                  *(float *)((long)*pauVar16 + 8) = fVar28;
                  sVar21 = sVar4;
                }
              }
              else {
                auVar135._8_4_ = fVar28;
                auVar135._0_8_ = sVar21;
                auVar135._12_4_ = 0;
                auVar100._8_4_ = fVar47;
                auVar100._0_8_ = sVar4;
                auVar100._12_4_ = 0;
                lVar15 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                uVar5 = *(undefined8 *)(uVar20 + lVar15 * 8);
                fVar51 = local_1138[lVar15];
                auVar113._8_4_ = fVar51;
                auVar113._0_8_ = uVar5;
                auVar113._12_4_ = 0;
                auVar108._8_4_ = -(uint)((int)fVar28 < (int)fVar47);
                uVar22 = uVar22 - 1 & uVar22;
                if (uVar22 == 0) {
                  auVar108._4_4_ = auVar108._8_4_;
                  auVar108._0_4_ = auVar108._8_4_;
                  auVar108._12_4_ = auVar108._8_4_;
                  auVar98._8_4_ = fVar47;
                  auVar98._0_8_ = sVar4;
                  auVar98._12_4_ = 0;
                  auVar99 = blendvps(auVar98,auVar135,auVar108);
                  auVar80 = blendvps(auVar135,auVar100,auVar108);
                  auVar32._8_4_ = -(uint)(auVar99._8_4_ < (int)fVar51);
                  auVar32._4_4_ = auVar32._8_4_;
                  auVar32._0_4_ = auVar32._8_4_;
                  auVar32._12_4_ = auVar32._8_4_;
                  auVar107._8_4_ = fVar51;
                  auVar107._0_8_ = uVar5;
                  auVar107._12_4_ = 0;
                  auVar108 = blendvps(auVar107,auVar99,auVar32);
                  auVar100 = blendvps(auVar99,auVar113,auVar32);
                  auVar33._8_4_ = -(uint)(auVar80._8_4_ < auVar100._8_4_);
                  auVar33._4_4_ = auVar33._8_4_;
                  auVar33._0_4_ = auVar33._8_4_;
                  auVar33._12_4_ = auVar33._8_4_;
                  auVar135 = blendvps(auVar100,auVar80,auVar33);
                  auVar80 = blendvps(auVar80,auVar100,auVar33);
                  *pauVar16 = auVar80;
                  pauVar16[1] = auVar135;
                  sVar21 = auVar108._0_8_;
                  pauVar17 = pauVar16 + 2;
                  unaff_R14 = (undefined1 (*) [16])0x0;
                }
                else {
                  unaff_R14 = (undefined1 (*) [16])0x0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> (long)unaff_R14 & 1) == 0;
                        unaff_R14 = (undefined1 (*) [16])((long)*unaff_R14 + 1)) {
                    }
                  }
                  auVar99._4_4_ = auVar108._8_4_;
                  auVar99._0_4_ = auVar108._8_4_;
                  auVar99._8_4_ = auVar108._8_4_;
                  auVar99._12_4_ = auVar108._8_4_;
                  auVar108 = blendvps(auVar100,auVar135,auVar99);
                  auVar80 = blendvps(auVar135,auVar100,auVar99);
                  auVar112._8_4_ = local_1138[(long)unaff_R14];
                  auVar112._0_8_ = *(undefined8 *)(uVar20 + (long)unaff_R14 * 8);
                  auVar112._12_4_ = 0;
                  auVar34._8_4_ = -(uint)((int)fVar51 < (int)local_1138[(long)unaff_R14]);
                  auVar34._4_4_ = auVar34._8_4_;
                  auVar34._0_4_ = auVar34._8_4_;
                  auVar34._12_4_ = auVar34._8_4_;
                  auVar100 = blendvps(auVar112,auVar113,auVar34);
                  auVar135 = blendvps(auVar113,auVar112,auVar34);
                  auVar35._8_4_ = -(uint)(auVar80._8_4_ < auVar135._8_4_);
                  auVar35._4_4_ = auVar35._8_4_;
                  auVar35._0_4_ = auVar35._8_4_;
                  auVar35._12_4_ = auVar35._8_4_;
                  auVar113 = blendvps(auVar135,auVar80,auVar35);
                  auVar80 = blendvps(auVar80,auVar135,auVar35);
                  auVar36._8_4_ = -(uint)(auVar108._8_4_ < auVar100._8_4_);
                  auVar36._4_4_ = auVar36._8_4_;
                  auVar36._0_4_ = auVar36._8_4_;
                  auVar36._12_4_ = auVar36._8_4_;
                  auVar135 = blendvps(auVar100,auVar108,auVar36);
                  auVar100 = blendvps(auVar108,auVar100,auVar36);
                  auVar37._8_4_ = -(uint)(auVar100._8_4_ < auVar113._8_4_);
                  auVar37._4_4_ = auVar37._8_4_;
                  auVar37._0_4_ = auVar37._8_4_;
                  auVar37._12_4_ = auVar37._8_4_;
                  auVar108 = blendvps(auVar113,auVar100,auVar37);
                  auVar100 = blendvps(auVar100,auVar113,auVar37);
                  *pauVar16 = auVar80;
                  pauVar16[1] = auVar100;
                  pauVar16[2] = auVar108;
                  sVar21 = auVar135._0_8_;
                  pauVar13 = (undefined1 (*) [16])0x0;
                  pauVar17 = pauVar16 + 3;
                }
              }
            }
          }
        }
        else {
          pauVar13 = (undefined1 (*) [16])0x6;
        }
        pauVar16 = pauVar17;
      } while ((int)pauVar13 == 0);
    } while ((int)pauVar13 != 6);
    uVar20 = (ulong)((uint)sVar21 & 0xf);
    if (uVar20 != 8) {
      uVar22 = sVar21 & 0xfffffffffffffff0;
      fVar123 = *(float *)(ray + k * 4);
      fStack_1140 = *(float *)(ray + k * 4 + 0x10);
      fStack_1150 = *(float *)(ray + k * 4 + 0x20);
      local_f88 = *(float *)(ray + k * 4 + 0x40);
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      local_f98 = *(float *)(ray + k * 4 + 0x50);
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      local_fa8 = *(float *)(ray + k * 4 + 0x60);
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      lVar15 = 0;
      fStack_114c = fStack_1150;
      fStack_113c = fStack_1140;
      local_1158 = fStack_1150;
      fStack_1154 = fStack_1150;
      local_1148 = fStack_1140;
      fStack_1144 = fStack_1140;
      do {
        lVar27 = lVar15 * 0xe0;
        puVar2 = (undefined8 *)(uVar22 + 0xd0 + lVar27);
        local_1048 = *puVar2;
        uStack_1040 = puVar2[1];
        pfVar1 = (float *)(uVar22 + lVar27);
        fVar30 = *pfVar1;
        fVar49 = pfVar1[1];
        fVar53 = pfVar1[2];
        fVar57 = pfVar1[3];
        pfVar1 = (float *)(uVar22 + 0x10 + lVar27);
        fVar139 = *pfVar1;
        fVar141 = pfVar1[1];
        fVar143 = pfVar1[2];
        fVar145 = pfVar1[3];
        pfVar1 = (float *)(uVar22 + 0x30 + lVar27);
        fVar59 = fVar30 - *pfVar1;
        fVar66 = fVar49 - pfVar1[1];
        fVar69 = fVar53 - pfVar1[2];
        fVar72 = fVar57 - pfVar1[3];
        pfVar1 = (float *)(uVar22 + 0x20 + lVar27);
        fVar89 = *pfVar1;
        fVar95 = pfVar1[1];
        fVar96 = pfVar1[2];
        fVar97 = pfVar1[3];
        pfVar1 = (float *)(uVar22 + 0x40 + lVar27);
        fVar83 = fVar139 - *pfVar1;
        fVar87 = fVar141 - pfVar1[1];
        fVar103 = fVar143 - pfVar1[2];
        fVar105 = fVar145 - pfVar1[3];
        pfVar3 = (float *)(uVar22 + 0x90 + lVar27);
        pfVar1 = (float *)(uVar22 + 0x50 + lVar27);
        fVar111 = fVar89 - *pfVar1;
        fVar114 = fVar95 - pfVar1[1];
        fVar115 = fVar96 - pfVar1[2];
        fVar116 = fVar97 - pfVar1[3];
        fVar132 = *pfVar3 - fVar30;
        fVar136 = pfVar3[1] - fVar49;
        fVar137 = pfVar3[2] - fVar53;
        fVar138 = pfVar3[3] - fVar57;
        pfVar1 = (float *)(uVar22 + 0xa0 + lVar27);
        fVar60 = *pfVar1 - fVar139;
        fVar67 = pfVar1[1] - fVar141;
        fVar70 = pfVar1[2] - fVar143;
        fVar28 = pfVar1[3] - fVar145;
        pfVar1 = (float *)(uVar22 + 0xb0 + lVar27);
        fVar117 = *pfVar1 - fVar89;
        fVar120 = pfVar1[1] - fVar95;
        fVar121 = pfVar1[2] - fVar96;
        fVar122 = pfVar1[3] - fVar97;
        fVar30 = fVar30 - fVar123;
        fVar49 = fVar49 - fVar123;
        fVar53 = fVar53 - fVar123;
        fVar57 = fVar57 - fVar123;
        fVar89 = fVar89 - local_1158;
        fVar95 = fVar95 - fStack_1154;
        fVar96 = fVar96 - fStack_1150;
        fVar97 = fVar97 - fStack_114c;
        fVar124 = fVar89 * local_f88 - fVar30 * local_fa8;
        fVar125 = fVar95 * fStack_f84 - fVar49 * fStack_fa4;
        fVar126 = fVar96 * fStack_f80 - fVar53 * fStack_fa0;
        fVar127 = fVar97 * fStack_f7c - fVar57 * fStack_f9c;
        local_10f8 = fVar111 * fVar60 - fVar83 * fVar117;
        fStack_10f4 = fVar114 * fVar67 - fVar87 * fVar120;
        fStack_10f0 = fVar115 * fVar70 - fVar103 * fVar121;
        fStack_10ec = fVar116 * fVar28 - fVar105 * fVar122;
        fVar139 = fVar139 - local_1148;
        fVar141 = fVar141 - fStack_1144;
        fVar143 = fVar143 - fStack_1140;
        fVar145 = fVar145 - fStack_113c;
        fVar31 = fVar30 * local_f98 - fVar139 * local_f88;
        fVar50 = fVar49 * fStack_f94 - fVar141 * fStack_f84;
        fVar54 = fVar53 * fStack_f90 - fVar143 * fStack_f80;
        fVar58 = fVar57 * fStack_f8c - fVar145 * fStack_f7c;
        fVar85 = fVar59 * fVar117 - fVar111 * fVar132;
        fVar102 = fVar66 * fVar120 - fVar114 * fVar136;
        fVar104 = fVar69 * fVar121 - fVar115 * fVar137;
        fVar106 = fVar72 * fVar122 - fVar116 * fVar138;
        fVar128 = fVar83 * fVar132 - fVar59 * fVar60;
        fVar129 = fVar87 * fVar136 - fVar66 * fVar67;
        fVar130 = fVar103 * fVar137 - fVar69 * fVar70;
        fVar131 = fVar105 * fVar138 - fVar72 * fVar28;
        fVar140 = fVar139 * local_fa8 - fVar89 * local_f98;
        fVar142 = fVar141 * fStack_fa4 - fVar95 * fStack_f94;
        fVar144 = fVar143 * fStack_fa0 - fVar96 * fStack_f90;
        fVar146 = fVar145 * fStack_f9c - fVar97 * fStack_f8c;
        local_11b8 = CONCAT44(fVar129,fVar128);
        fVar47 = local_10f8 * local_f88 + fVar85 * local_f98 + fVar128 * local_fa8;
        fVar51 = fStack_10f4 * fStack_f84 + fVar102 * fStack_f94 + fVar129 * fStack_fa4;
        fVar55 = fStack_10f0 * fStack_f80 + fVar104 * fStack_f90 + fVar130 * fStack_fa0;
        fVar73 = fStack_10ec * fStack_f7c + fVar106 * fStack_f8c + fVar131 * fStack_f9c;
        uVar48 = (uint)fVar47 & 0x80000000;
        uVar52 = (uint)fVar51 & 0x80000000;
        uVar56 = (uint)fVar55 & 0x80000000;
        uVar74 = (uint)fVar73 & 0x80000000;
        local_1138[0] =
             (float)((uint)(fVar132 * fVar140 + fVar60 * fVar124 + fVar117 * fVar31) ^ uVar48);
        local_1138[1] =
             (float)((uint)(fVar136 * fVar142 + fVar67 * fVar125 + fVar120 * fVar50) ^ uVar52);
        local_1138[2] =
             (float)((uint)(fVar137 * fVar144 + fVar70 * fVar126 + fVar121 * fVar54) ^ uVar56);
        local_1138[3] =
             (float)((uint)(fVar138 * fVar146 + fVar28 * fVar127 + fVar122 * fVar58) ^ uVar74);
        local_1128 = (float)((uint)(fVar140 * fVar59 + fVar124 * fVar83 + fVar31 * fVar111) ^ uVar48
                            );
        fStack_1124 = (float)((uint)(fVar142 * fVar66 + fVar125 * fVar87 + fVar50 * fVar114) ^
                             uVar52);
        fStack_1120 = (float)((uint)(fVar144 * fVar69 + fVar126 * fVar103 + fVar54 * fVar115) ^
                             uVar56);
        fStack_111c = (float)((uint)(fVar146 * fVar72 + fVar127 * fVar105 + fVar58 * fVar116) ^
                             uVar74);
        fVar31 = ABS(fVar47);
        fVar50 = ABS(fVar51);
        local_1108._0_8_ = CONCAT44(fVar51,fVar47) & 0x7fffffff7fffffff;
        local_1108._8_4_ = ABS(fVar55);
        local_1108._12_4_ = ABS(fVar73);
        bVar11 = ((0.0 <= local_1128 && 0.0 <= local_1138[0]) && fVar47 != 0.0) &&
                 local_1138[0] + local_1128 <= fVar31;
        auVar75._0_4_ = -(uint)bVar11;
        bVar12 = ((0.0 <= fStack_1124 && 0.0 <= local_1138[1]) && fVar51 != 0.0) &&
                 local_1138[1] + fStack_1124 <= fVar50;
        auVar75._4_4_ = -(uint)bVar12;
        bVar10 = ((0.0 <= fStack_1120 && 0.0 <= local_1138[2]) && fVar55 != 0.0) &&
                 local_1138[2] + fStack_1120 <= local_1108._8_4_;
        auVar75._8_4_ = -(uint)bVar10;
        bVar9 = ((0.0 <= fStack_111c && 0.0 <= local_1138[3]) && fVar73 != 0.0) &&
                local_1138[3] + fStack_111c <= local_1108._12_4_;
        auVar75._12_4_ = -(uint)bVar9;
        lVar27 = lVar27 + uVar22;
        uVar29 = movmskps((int)unaff_R14,auVar75);
        if (uVar29 != 0) {
          local_1118._0_4_ =
               uVar48 ^ (uint)(fVar30 * local_10f8 + fVar139 * fVar85 + fVar89 * fVar128);
          local_1118._4_4_ =
               uVar52 ^ (uint)(fVar49 * fStack_10f4 + fVar141 * fVar102 + fVar95 * fVar129);
          fStack_1110 = (float)(uVar56 ^ (uint)(fVar53 * fStack_10f0 +
                                               fVar143 * fVar104 + fVar96 * fVar130));
          fStack_110c = (float)(uVar74 ^ (uint)(fVar57 * fStack_10ec +
                                               fVar145 * fVar106 + fVar97 * fVar131));
          fVar30 = *(float *)(ray + k * 4 + 0x30);
          fVar49 = *(float *)(ray + k * 4 + 0x80);
          auVar90._0_4_ = fVar49 * fVar31;
          auVar90._4_4_ = fVar49 * fVar50;
          auVar90._8_4_ = fVar49 * local_1108._8_4_;
          auVar90._12_4_ = fVar49 * local_1108._12_4_;
          bVar11 = (fVar30 * fVar31 < (float)local_1118._0_4_ &&
                   (float)local_1118._0_4_ <= auVar90._0_4_) && bVar11;
          bVar12 = (fVar30 * fVar50 < (float)local_1118._4_4_ &&
                   (float)local_1118._4_4_ <= auVar90._4_4_) && bVar12;
          local_1168._0_8_ = CONCAT44(-(uint)bVar12,-(uint)bVar11);
          bVar10 = (fVar30 * local_1108._8_4_ < fStack_1110 && fStack_1110 <= auVar90._8_4_) &&
                   bVar10;
          local_1168._8_4_ = -(uint)bVar10;
          bVar9 = (fVar30 * local_1108._12_4_ < fStack_110c && fStack_110c <= auVar90._12_4_) &&
                  bVar9;
          local_1168._12_4_ = -(uint)bVar9;
          uVar29 = movmskps(uVar29,local_1168);
          if (uVar29 != 0) {
            local_10e8 = CONCAT44(fVar102,fVar85);
            uStack_10e0 = CONCAT44(fVar106,fVar104);
            local_10d8._8_8_ = CONCAT44(fVar131,fVar130);
            local_10d8._0_8_ = local_11b8;
            local_10c8 = local_1168;
            local_1058._8_8_ = uStack_1020;
            local_1058._0_8_ = local_1028;
            pSVar6 = context->scene;
            auVar80 = rcpps(auVar90,local_1108);
            fVar30 = auVar80._0_4_;
            fVar49 = auVar80._4_4_;
            fVar57 = auVar80._8_4_;
            fVar139 = auVar80._12_4_;
            fVar141 = (float)DAT_01feca10;
            fVar143 = DAT_01feca10._4_4_;
            fVar145 = DAT_01feca10._12_4_;
            fVar53 = DAT_01feca10._8_4_;
            fVar30 = (fVar141 - fVar31 * fVar30) * fVar30 + fVar30;
            fVar49 = (fVar143 - fVar50 * fVar49) * fVar49 + fVar49;
            fVar57 = (fVar53 - local_1108._8_4_ * fVar57) * fVar57 + fVar57;
            fVar139 = (fVar145 - local_1108._12_4_ * fVar139) * fVar139 + fVar139;
            auVar61._0_4_ = (float)local_1118._0_4_ * fVar30;
            auVar61._4_4_ = (float)local_1118._4_4_ * fVar49;
            auVar61._8_4_ = fStack_1110 * fVar57;
            auVar61._12_4_ = fStack_110c * fVar139;
            local_1098 = auVar61;
            auVar133._0_4_ = local_1138[0] * fVar30;
            auVar133._4_4_ = local_1138[1] * fVar49;
            auVar133._8_4_ = local_1138[2] * fVar57;
            auVar133._12_4_ = local_1138[3] * fVar139;
            auVar135 = minps(auVar133,_DAT_01feca10);
            auVar76._0_4_ = fVar30 * local_1128;
            auVar76._4_4_ = fVar49 * fStack_1124;
            auVar76._8_4_ = fVar57 * fStack_1120;
            auVar76._12_4_ = fVar139 * fStack_111c;
            auVar80 = minps(auVar76,_DAT_01feca10);
            auVar91._0_4_ = fVar141 - auVar135._0_4_;
            auVar91._4_4_ = fVar143 - auVar135._4_4_;
            auVar91._8_4_ = fVar53 - auVar135._8_4_;
            auVar91._12_4_ = fVar145 - auVar135._12_4_;
            auVar109._0_4_ = fVar141 - auVar80._0_4_;
            auVar109._4_4_ = fVar143 - auVar80._4_4_;
            auVar109._8_4_ = fVar53 - auVar80._8_4_;
            auVar109._12_4_ = fVar145 - auVar80._12_4_;
            local_10b8 = blendvps(auVar135,auVar91,local_1058);
            local_10a8 = blendvps(auVar80,auVar109,local_1058);
            local_1088[0] = local_10f8;
            local_1088[1] = fStack_10f4;
            local_1088[2] = fStack_10f0;
            local_1088[3] = fStack_10ec;
            local_1078 = CONCAT44(fVar102,fVar85);
            uStack_1070 = CONCAT44(fVar106,fVar104);
            local_1068._8_8_ = CONCAT44(fVar131,fVar130);
            local_1068._0_8_ = local_11b8;
            auVar39._8_4_ = local_1168._8_4_;
            auVar39._0_8_ = local_1168._0_8_;
            auVar39._12_4_ = local_1168._12_4_;
            auVar135 = blendvps(_DAT_01feb9f0,auVar61,auVar39);
            auVar92._4_4_ = auVar135._0_4_;
            auVar92._0_4_ = auVar135._4_4_;
            auVar92._8_4_ = auVar135._12_4_;
            auVar92._12_4_ = auVar135._8_4_;
            auVar80 = minps(auVar92,auVar135);
            auVar40._0_8_ = auVar80._8_8_;
            auVar40._8_4_ = auVar80._0_4_;
            auVar40._12_4_ = auVar80._4_4_;
            auVar80 = minps(auVar40,auVar80);
            auVar41._0_8_ =
                 CONCAT44(-(uint)(auVar80._4_4_ == auVar135._4_4_ && bVar12),
                          -(uint)(auVar80._0_4_ == auVar135._0_4_ && bVar11));
            auVar41._8_4_ = -(uint)(auVar80._8_4_ == auVar135._8_4_ && bVar10);
            auVar41._12_4_ = -(uint)(auVar80._12_4_ == auVar135._12_4_ && bVar9);
            iVar23 = movmskps((int)pSVar6,auVar41);
            auVar118 = local_1168;
            if (iVar23 != 0) {
              auVar118._8_4_ = auVar41._8_4_;
              auVar118._0_8_ = auVar41._0_8_;
              auVar118._12_4_ = auVar41._12_4_;
            }
            uVar24 = movmskps(iVar23,auVar118);
            uVar26 = CONCAT44((int)((ulong)pSVar6 >> 0x20),uVar24);
            local_11c8 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> local_11c8 & 1) == 0; local_11c8 = local_11c8 + 1) {
              }
            }
            pRVar7 = (pSVar6->geometries).items;
            uVar48 = *(uint *)(ray + k * 4 + 0x90);
            uVar29 = *(uint *)(lVar27 + 0xc0 + local_11c8 * 4);
            while (pGVar8 = pRVar7[uVar29].ptr, (pGVar8->mask & uVar48) == 0) {
              *(undefined4 *)(local_1168 + local_11c8 * 4) = 0;
              uVar29 = movmskps((int)pGVar8,local_1168);
              if (uVar29 == 0) goto LAB_0028156c;
              auVar135 = blendvps(_DAT_01feb9f0,auVar61,local_1168);
              auVar101._4_4_ = auVar135._0_4_;
              auVar101._0_4_ = auVar135._4_4_;
              auVar101._8_4_ = auVar135._12_4_;
              auVar101._12_4_ = auVar135._8_4_;
              auVar80 = minps(auVar101,auVar135);
              auVar77._0_8_ = auVar80._8_8_;
              auVar77._8_4_ = auVar80._0_4_;
              auVar77._12_4_ = auVar80._4_4_;
              auVar80 = minps(auVar77,auVar80);
              auVar78._0_8_ =
                   CONCAT44(-(uint)(auVar80._4_4_ == auVar135._4_4_) & local_1168._4_4_,
                            -(uint)(auVar80._0_4_ == auVar135._0_4_) & local_1168._0_4_);
              auVar78._8_4_ = -(uint)(auVar80._8_4_ == auVar135._8_4_) & local_1168._8_4_;
              auVar78._12_4_ = -(uint)(auVar80._12_4_ == auVar135._12_4_) & local_1168._12_4_;
              iVar23 = movmskps(uVar29,auVar78);
              auVar42 = local_1168;
              if (iVar23 != 0) {
                auVar42._8_4_ = auVar78._8_4_;
                auVar42._0_8_ = auVar78._0_8_;
                auVar42._12_4_ = auVar78._12_4_;
              }
              uVar24 = movmskps(iVar23,auVar42);
              uVar26 = CONCAT44((int)((ulong)pGVar8 >> 0x20),uVar24);
              local_11c8 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> local_11c8 & 1) == 0; local_11c8 = local_11c8 + 1) {
                }
              }
              uVar29 = *(uint *)(lVar27 + 0xc0 + local_11c8 * 4);
            }
            uVar24 = *(undefined4 *)(local_10b8 + local_11c8 * 4);
            uVar25 = *(undefined4 *)(local_10a8 + local_11c8 * 4);
            *(float *)(ray + k * 4 + 0x80) = local_1088[local_11c8 + -4];
            *(float *)(ray + k * 4 + 0xc0) = local_1088[local_11c8];
            *(undefined4 *)(ray + k * 4 + 0xd0) =
                 *(undefined4 *)((long)&local_1078 + local_11c8 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1068 + local_11c8 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar24;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar25;
            *(undefined4 *)(ray + k * 4 + 0x110) =
                 *(undefined4 *)((long)&local_1048 + local_11c8 * 4);
            *(uint *)(ray + k * 4 + 0x120) = uVar29;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar29 = context->user->instPrimID[0];
            *(uint *)(ray + k * 4 + 0x140) = uVar29;
          }
        }
LAB_0028156c:
        fVar139 = *(float *)(lVar27 + 0x60);
        fVar141 = *(float *)(lVar27 + 100);
        fVar143 = *(float *)(lVar27 + 0x68);
        fVar145 = *(float *)(lVar27 + 0x6c);
        fVar72 = fVar139 - *(float *)(lVar27 + 0x90);
        fVar28 = fVar141 - *(float *)(lVar27 + 0x94);
        fVar47 = fVar143 - *(float *)(lVar27 + 0x98);
        fVar51 = fVar145 - *(float *)(lVar27 + 0x9c);
        fVar89 = *(float *)(lVar27 + 0x70);
        fVar95 = *(float *)(lVar27 + 0x74);
        fVar96 = *(float *)(lVar27 + 0x78);
        fVar97 = *(float *)(lVar27 + 0x7c);
        fVar105 = fVar89 - *(float *)(lVar27 + 0xa0);
        fVar106 = fVar95 - *(float *)(lVar27 + 0xa4);
        fVar111 = fVar96 - *(float *)(lVar27 + 0xa8);
        fVar114 = fVar97 - *(float *)(lVar27 + 0xac);
        fVar31 = *(float *)(lVar27 + 0x80);
        fVar50 = *(float *)(lVar27 + 0x84);
        fVar54 = *(float *)(lVar27 + 0x88);
        fVar58 = *(float *)(lVar27 + 0x8c);
        fVar121 = fVar31 - *(float *)(lVar27 + 0xb0);
        fVar124 = fVar50 - *(float *)(lVar27 + 0xb4);
        fVar126 = fVar54 - *(float *)(lVar27 + 0xb8);
        fVar128 = fVar58 - *(float *)(lVar27 + 0xbc);
        fVar130 = *(float *)(lVar27 + 0x30) - fVar139;
        fVar131 = *(float *)(lVar27 + 0x34) - fVar141;
        fVar132 = *(float *)(lVar27 + 0x38) - fVar143;
        fVar136 = *(float *)(lVar27 + 0x3c) - fVar145;
        fVar115 = *(float *)(lVar27 + 0x40) - fVar89;
        fVar116 = *(float *)(lVar27 + 0x44) - fVar95;
        fVar117 = *(float *)(lVar27 + 0x48) - fVar96;
        fVar120 = *(float *)(lVar27 + 0x4c) - fVar97;
        fVar87 = *(float *)(lVar27 + 0x50) - fVar31;
        fVar102 = *(float *)(lVar27 + 0x54) - fVar50;
        fVar103 = *(float *)(lVar27 + 0x58) - fVar54;
        fVar104 = *(float *)(lVar27 + 0x5c) - fVar58;
        local_10f8 = fVar121 * fVar115 - fVar105 * fVar87;
        fStack_10f4 = fVar124 * fVar116 - fVar106 * fVar102;
        fStack_10f0 = fVar126 * fVar117 - fVar111 * fVar103;
        fStack_10ec = fVar128 * fVar120 - fVar114 * fVar104;
        fVar30 = *(float *)(ray + k * 4);
        fVar49 = *(float *)(ray + k * 4 + 0x10);
        fVar53 = *(float *)(ray + k * 4 + 0x40);
        fVar57 = *(float *)(ray + k * 4 + 0x50);
        fVar139 = fVar139 - fVar30;
        fVar141 = fVar141 - fVar30;
        fVar143 = fVar143 - fVar30;
        fVar145 = fVar145 - fVar30;
        fVar89 = fVar89 - fVar49;
        fVar95 = fVar95 - fVar49;
        fVar96 = fVar96 - fVar49;
        fVar97 = fVar97 - fVar49;
        fVar59 = fVar139 * fVar57 - fVar89 * fVar53;
        fVar60 = fVar141 * fVar57 - fVar95 * fVar53;
        fVar66 = fVar143 * fVar57 - fVar96 * fVar53;
        fVar67 = fVar145 * fVar57 - fVar97 * fVar53;
        fVar55 = fVar72 * fVar87 - fVar121 * fVar130;
        fVar73 = fVar28 * fVar102 - fVar124 * fVar131;
        fVar83 = fVar47 * fVar103 - fVar126 * fVar132;
        fVar85 = fVar51 * fVar104 - fVar128 * fVar136;
        fVar30 = *(float *)(ray + k * 4 + 0x20);
        fVar49 = *(float *)(ray + k * 4 + 0x60);
        fVar31 = fVar31 - fVar30;
        fVar50 = fVar50 - fVar30;
        fVar54 = fVar54 - fVar30;
        fVar58 = fVar58 - fVar30;
        fVar137 = fVar31 * fVar53 - fVar139 * fVar49;
        fVar138 = fVar50 * fVar53 - fVar141 * fVar49;
        fVar140 = fVar54 * fVar53 - fVar143 * fVar49;
        fVar142 = fVar58 * fVar53 - fVar145 * fVar49;
        local_10d8._0_4_ = fVar105 * fVar130 - fVar72 * fVar115;
        local_10d8._4_4_ = fVar106 * fVar131 - fVar28 * fVar116;
        local_10d8._8_4_ = fVar111 * fVar132 - fVar47 * fVar117;
        local_10d8._12_4_ = fVar114 * fVar136 - fVar51 * fVar120;
        fVar122 = fVar89 * fVar49 - fVar31 * fVar57;
        fVar125 = fVar95 * fVar49 - fVar50 * fVar57;
        fVar127 = fVar96 * fVar49 - fVar54 * fVar57;
        fVar129 = fVar97 * fVar49 - fVar58 * fVar57;
        local_11c8 = CONCAT44(fVar73,fVar55);
        fVar30 = fVar53 * local_10f8 + fVar57 * fVar55 + fVar49 * local_10d8._0_4_;
        fVar69 = fVar53 * fStack_10f4 + fVar57 * fVar73 + fVar49 * local_10d8._4_4_;
        fVar70 = fVar53 * fStack_10f0 + fVar57 * fVar83 + fVar49 * local_10d8._8_4_;
        fVar49 = fVar53 * fStack_10ec + fVar57 * fVar85 + fVar49 * local_10d8._12_4_;
        uVar48 = (uint)fVar30 & (uint)DAT_01fec6d0;
        uVar52 = (uint)fVar69 & DAT_01fec6d0._4_4_;
        uVar56 = (uint)fVar70 & DAT_01fec6d0._8_4_;
        uVar74 = (uint)fVar49 & DAT_01fec6d0._12_4_;
        local_1138[0] =
             (float)((uint)(fVar130 * fVar122 + fVar115 * fVar137 + fVar87 * fVar59) ^ uVar48);
        local_1138[1] =
             (float)((uint)(fVar131 * fVar125 + fVar116 * fVar138 + fVar102 * fVar60) ^ uVar52);
        local_1138[2] =
             (float)((uint)(fVar132 * fVar127 + fVar117 * fVar140 + fVar103 * fVar66) ^ uVar56);
        local_1138[3] =
             (float)((uint)(fVar136 * fVar129 + fVar120 * fVar142 + fVar104 * fVar67) ^ uVar74);
        local_1128 = (float)((uint)(fVar122 * fVar72 + fVar137 * fVar105 + fVar59 * fVar121) ^
                            uVar48);
        fStack_1124 = (float)((uint)(fVar125 * fVar28 + fVar138 * fVar106 + fVar60 * fVar124) ^
                             uVar52);
        fStack_1120 = (float)((uint)(fVar127 * fVar47 + fVar140 * fVar111 + fVar66 * fVar126) ^
                             uVar56);
        fStack_111c = (float)((uint)(fVar129 * fVar51 + fVar142 * fVar114 + fVar67 * fVar128) ^
                             uVar74);
        fVar53 = ABS(fVar30);
        fVar57 = ABS(fVar69);
        local_1108._0_8_ = CONCAT44(fVar69,fVar30) & 0x7fffffff7fffffff;
        local_1108._8_4_ = ABS(fVar70);
        local_1108._12_4_ = ABS(fVar49);
        bVar11 = local_1138[0] + local_1128 <= fVar53 &&
                 ((0.0 <= local_1138[0] && 0.0 <= local_1128) && fVar30 != 0.0);
        auVar38._0_4_ = -(uint)bVar11;
        bVar12 = local_1138[1] + fStack_1124 <= fVar57 &&
                 ((0.0 <= local_1138[1] && 0.0 <= fStack_1124) && fVar69 != 0.0);
        auVar38._4_4_ = -(uint)bVar12;
        bVar10 = local_1138[2] + fStack_1120 <= local_1108._8_4_ &&
                 ((0.0 <= local_1138[2] && 0.0 <= fStack_1120) && fVar70 != 0.0);
        auVar38._8_4_ = -(uint)bVar10;
        bVar9 = local_1138[3] + fStack_111c <= local_1108._12_4_ &&
                ((0.0 <= local_1138[3] && 0.0 <= fStack_111c) && fVar49 != 0.0);
        auVar38._12_4_ = -(uint)bVar9;
        uVar29 = movmskps(uVar29,auVar38);
        unaff_R14 = (undefined1 (*) [16])(ulong)uVar29;
        if (uVar29 != 0) {
          local_1118._0_4_ =
               uVar48 ^ (uint)(fVar139 * local_10f8 + fVar89 * fVar55 + fVar31 * local_10d8._0_4_);
          local_1118._4_4_ =
               uVar52 ^ (uint)(fVar141 * fStack_10f4 + fVar95 * fVar73 + fVar50 * local_10d8._4_4_);
          fStack_1110 = (float)(uVar56 ^ (uint)(fVar143 * fStack_10f0 +
                                               fVar96 * fVar83 + fVar54 * local_10d8._8_4_));
          fStack_110c = (float)(uVar74 ^ (uint)(fVar145 * fStack_10ec +
                                               fVar97 * fVar85 + fVar58 * local_10d8._12_4_));
          fVar30 = *(float *)(ray + k * 4 + 0x30);
          fVar49 = *(float *)(ray + k * 4 + 0x80);
          auVar79._0_4_ = fVar49 * fVar53;
          auVar79._4_4_ = fVar49 * fVar57;
          auVar79._8_4_ = fVar49 * local_1108._8_4_;
          auVar79._12_4_ = fVar49 * local_1108._12_4_;
          bVar11 = (fVar30 * fVar53 < (float)local_1118._0_4_ &&
                   (float)local_1118._0_4_ <= auVar79._0_4_) && bVar11;
          bVar12 = (fVar30 * fVar57 < (float)local_1118._4_4_ &&
                   (float)local_1118._4_4_ <= auVar79._4_4_) && bVar12;
          local_1168._0_8_ = CONCAT44(-(uint)bVar12,-(uint)bVar11);
          bVar10 = (fVar30 * local_1108._8_4_ < fStack_1110 && fStack_1110 <= auVar79._8_4_) &&
                   bVar10;
          local_1168._8_4_ = -(uint)bVar10;
          bVar9 = (fVar30 * local_1108._12_4_ < fStack_110c && fStack_110c <= auVar79._12_4_) &&
                  bVar9;
          local_1168._12_4_ = -(uint)bVar9;
          uVar29 = movmskps(uVar29,local_1168);
          unaff_R14 = (undefined1 (*) [16])(ulong)uVar29;
          if (uVar29 != 0) {
            local_10e8 = local_11c8;
            uStack_10e0 = CONCAT44(fVar85,fVar83);
            local_10c8 = local_1168;
            local_1058._8_8_ = uStack_1030;
            local_1058._0_8_ = local_1038;
            pSVar6 = context->scene;
            auVar80 = rcpps(auVar79,local_1108);
            fVar30 = auVar80._0_4_;
            fVar49 = auVar80._4_4_;
            fVar141 = auVar80._8_4_;
            fVar143 = auVar80._12_4_;
            fVar145 = (float)DAT_01feca10;
            fVar89 = DAT_01feca10._4_4_;
            fVar95 = DAT_01feca10._12_4_;
            fVar139 = DAT_01feca10._8_4_;
            fVar30 = (fVar145 - fVar53 * fVar30) * fVar30 + fVar30;
            fVar49 = (fVar89 - fVar57 * fVar49) * fVar49 + fVar49;
            fVar141 = (fVar139 - local_1108._8_4_ * fVar141) * fVar141 + fVar141;
            fVar143 = (fVar95 - local_1108._12_4_ * fVar143) * fVar143 + fVar143;
            auVar110._0_4_ = (float)local_1118._0_4_ * fVar30;
            auVar110._4_4_ = (float)local_1118._4_4_ * fVar49;
            auVar110._8_4_ = fStack_1110 * fVar141;
            auVar110._12_4_ = fStack_110c * fVar143;
            local_1098 = auVar110;
            auVar134._0_4_ = local_1138[0] * fVar30;
            auVar134._4_4_ = local_1138[1] * fVar49;
            auVar134._8_4_ = local_1138[2] * fVar141;
            auVar134._12_4_ = local_1138[3] * fVar143;
            auVar135 = minps(auVar134,_DAT_01feca10);
            auVar62._0_4_ = fVar30 * local_1128;
            auVar62._4_4_ = fVar49 * fStack_1124;
            auVar62._8_4_ = fVar141 * fStack_1120;
            auVar62._12_4_ = fVar143 * fStack_111c;
            auVar80 = minps(auVar62,_DAT_01feca10);
            auVar81._0_4_ = fVar145 - auVar135._0_4_;
            auVar81._4_4_ = fVar89 - auVar135._4_4_;
            auVar81._8_4_ = fVar139 - auVar135._8_4_;
            auVar81._12_4_ = fVar95 - auVar135._12_4_;
            auVar93._0_4_ = fVar145 - auVar80._0_4_;
            auVar93._4_4_ = fVar89 - auVar80._4_4_;
            auVar93._8_4_ = fVar139 - auVar80._8_4_;
            auVar93._12_4_ = fVar95 - auVar80._12_4_;
            local_10b8 = blendvps(auVar135,auVar81,local_1058);
            local_10a8 = blendvps(auVar80,auVar93,local_1058);
            local_1088[0] = local_10f8;
            local_1088[1] = fStack_10f4;
            local_1088[2] = fStack_10f0;
            local_1088[3] = fStack_10ec;
            local_1078 = local_11c8;
            uStack_1070 = CONCAT44(fVar85,fVar83);
            local_1068 = local_10d8;
            auVar43._8_4_ = local_1168._8_4_;
            auVar43._0_8_ = local_1168._0_8_;
            auVar43._12_4_ = local_1168._12_4_;
            auVar135 = blendvps(_DAT_01feb9f0,auVar110,auVar43);
            auVar82._4_4_ = auVar135._0_4_;
            auVar82._0_4_ = auVar135._4_4_;
            auVar82._8_4_ = auVar135._12_4_;
            auVar82._12_4_ = auVar135._8_4_;
            auVar80 = minps(auVar82,auVar135);
            auVar44._0_8_ = auVar80._8_8_;
            auVar44._8_4_ = auVar80._0_4_;
            auVar44._12_4_ = auVar80._4_4_;
            auVar80 = minps(auVar44,auVar80);
            auVar45._0_8_ =
                 CONCAT44(-(uint)(auVar80._4_4_ == auVar135._4_4_ && bVar12),
                          -(uint)(auVar80._0_4_ == auVar135._0_4_ && bVar11));
            auVar45._8_4_ = -(uint)(auVar80._8_4_ == auVar135._8_4_ && bVar10);
            auVar45._12_4_ = -(uint)(auVar80._12_4_ == auVar135._12_4_ && bVar9);
            iVar23 = movmskps((int)pSVar6,auVar45);
            auVar119 = local_1168;
            if (iVar23 != 0) {
              auVar119._8_4_ = auVar45._8_4_;
              auVar119._0_8_ = auVar45._0_8_;
              auVar119._12_4_ = auVar45._12_4_;
            }
            uVar24 = movmskps(iVar23,auVar119);
            uVar26 = CONCAT44((int)((ulong)pSVar6 >> 0x20),uVar24);
            local_11c8 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> local_11c8 & 1) == 0; local_11c8 = local_11c8 + 1) {
              }
            }
            pRVar7 = (pSVar6->geometries).items;
            uVar29 = *(uint *)(ray + k * 4 + 0x90);
            uVar48 = *(uint *)(lVar27 + 0xc0 + local_11c8 * 4);
            while (pGVar8 = pRVar7[uVar48].ptr, (pGVar8->mask & uVar29) == 0) {
              *(undefined4 *)(local_1168 + local_11c8 * 4) = 0;
              uVar24 = (undefined4)((ulong)pGVar8 >> 0x20);
              iVar23 = movmskps((int)pGVar8,local_1168);
              unaff_R14 = (undefined1 (*) [16])CONCAT44(uVar24,iVar23);
              if (iVar23 == 0) goto LAB_0028171b;
              auVar135 = blendvps(_DAT_01feb9f0,auVar110,local_1168);
              auVar94._4_4_ = auVar135._0_4_;
              auVar94._0_4_ = auVar135._4_4_;
              auVar94._8_4_ = auVar135._12_4_;
              auVar94._12_4_ = auVar135._8_4_;
              auVar80 = minps(auVar94,auVar135);
              auVar63._0_8_ = auVar80._8_8_;
              auVar63._8_4_ = auVar80._0_4_;
              auVar63._12_4_ = auVar80._4_4_;
              auVar80 = minps(auVar63,auVar80);
              auVar64._0_8_ =
                   CONCAT44(-(uint)(auVar80._4_4_ == auVar135._4_4_) & local_1168._4_4_,
                            -(uint)(auVar80._0_4_ == auVar135._0_4_) & local_1168._0_4_);
              auVar64._8_4_ = -(uint)(auVar80._8_4_ == auVar135._8_4_) & local_1168._8_4_;
              auVar64._12_4_ = -(uint)(auVar80._12_4_ == auVar135._12_4_) & local_1168._12_4_;
              iVar23 = movmskps(iVar23,auVar64);
              auVar46 = local_1168;
              if (iVar23 != 0) {
                auVar46._8_4_ = auVar64._8_4_;
                auVar46._0_8_ = auVar64._0_8_;
                auVar46._12_4_ = auVar64._12_4_;
              }
              uVar25 = movmskps(iVar23,auVar46);
              uVar26 = CONCAT44(uVar24,uVar25);
              local_11c8 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> local_11c8 & 1) == 0; local_11c8 = local_11c8 + 1) {
                }
              }
              uVar48 = *(uint *)(lVar27 + 0xc0 + local_11c8 * 4);
            }
            uVar24 = *(undefined4 *)(local_10b8 + local_11c8 * 4);
            uVar25 = *(undefined4 *)(local_10a8 + local_11c8 * 4);
            *(float *)(ray + k * 4 + 0x80) = local_1088[local_11c8 + -4];
            *(float *)(ray + k * 4 + 0xc0) = local_1088[local_11c8];
            *(undefined4 *)(ray + k * 4 + 0xd0) =
                 *(undefined4 *)((long)&local_1078 + local_11c8 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1068 + local_11c8 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar24;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar25;
            *(undefined4 *)(ray + k * 4 + 0x110) =
                 *(undefined4 *)((long)&local_1048 + local_11c8 * 4);
            *(uint *)(ray + k * 4 + 0x120) = uVar48;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar29 = context->user->instPrimID[0];
            unaff_R14 = (undefined1 (*) [16])(ulong)uVar29;
            *(uint *)(ray + k * 4 + 0x140) = uVar29;
          }
        }
LAB_0028171b:
        lVar15 = lVar15 + 1;
      } while (lVar15 != uVar20 - 8);
    }
    iVar23 = *(int *)(ray + k * 4 + 0x80);
    fVar123 = local_fb8;
    fVar30 = fStack_fb4;
    fVar49 = fStack_fb0;
    fVar53 = fStack_fac;
    fVar57 = local_fc8;
    fVar139 = fStack_fc4;
    fVar141 = fStack_fc0;
    fVar143 = fStack_fbc;
    fVar145 = local_fd8;
    fVar89 = fStack_fd4;
    fVar95 = fStack_fd0;
    fVar96 = fStack_fcc;
    fVar97 = local_fe8;
    fVar31 = fStack_fe4;
    fVar50 = fStack_fe0;
    fVar54 = fStack_fdc;
    fVar58 = local_1008;
    fVar59 = fStack_1004;
    fVar60 = fStack_1000;
    fVar66 = fStack_ffc;
    iVar147 = local_1018;
    iVar148 = iStack_1014;
    iVar149 = iStack_1010;
    iVar150 = iStack_100c;
    iVar65 = iVar23;
    iVar68 = iVar23;
    iVar71 = iVar23;
    fVar67 = local_ff8;
    fVar69 = fStack_ff4;
    fVar70 = fStack_ff0;
    fVar72 = fStack_fec;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }